

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O2

bool __thiscall gmlc::networking::TcpAcceptor::start(TcpAcceptor *this,pointer *conn)

{
  bool bVar1;
  int __n;
  int __fd;
  string local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  shared_ptr<gmlc::networking::Socket> socket;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  shared_ptr<gmlc::networking::TcpAcceptor> ptr;
  
  if ((conn->super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      == (element_type *)0x0) {
    if (((this->accepting).activated._M_base._M_i & 1U) != 0) {
      concurrency::TriggerVariable::trigger(&this->accepting);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"tcpconnection is not valid",(allocator<char> *)&socket);
    logger(this,0,&local_b0);
  }
  else {
    if ((this->state)._M_i == CONNECTED) {
      bVar1 = concurrency::TriggerVariable::activate(&this->accepting);
      if (!bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"acceptor is already active",(allocator<char> *)&socket);
        __fd = 1;
        logger(this,1,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        TcpConnection::close
                  ((conn->
                   super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr,__fd);
        return false;
      }
      std::__shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&socket.super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>,
                 &(((conn->
                    super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr)->socket_).
                  super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>);
      asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::listen
                (&this->acceptor_,0x1000,__n);
      std::__shared_ptr<gmlc::networking::TcpAcceptor,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<gmlc::networking::TcpAcceptor,void>
                ((__shared_ptr<gmlc::networking::TcpAcceptor,(__gnu_cxx::_Lock_policy)2> *)&ptr,
                 (__weak_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2> *)this);
      local_48 = ptr.super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      uStack_40 = ptr.super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
      local_b0._M_string_length =
           (size_type)
           ptr.super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_b0.field_2._M_allocated_capacity =
           (size_type)
           ptr.super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      ptr.super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      ptr.super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_b0.field_2._8_8_ =
           (conn->super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      p_Stack_90 = (conn->
                   super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
      (conn->super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (conn->super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           = (element_type *)0x0;
      local_68 = (code *)0x0;
      pcStack_60 = (code *)0x0;
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      local_b0._M_dataplus._M_p = (pointer)this;
      local_58 = (element_type *)local_b0.field_2._8_8_;
      p_Stack_50 = p_Stack_90;
      local_78._M_unused._M_object = operator_new(0x28);
      *(TcpAcceptor **)local_78._M_unused._0_8_ = this;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_allocated_capacity = 0;
      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(element_type **)((long)local_78._M_unused._0_8_ + 0x18) = local_58;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_78._M_unused._0_8_ + 0x20) =
           p_Stack_50;
      local_b0.field_2._8_8_ = 0;
      *(undefined4 *)((long)local_78._M_unused._0_8_ + 8) = (undefined4)local_48;
      *(undefined4 *)((long)local_78._M_unused._0_8_ + 0xc) = local_48._4_4_;
      *(undefined4 *)((long)local_78._M_unused._0_8_ + 0x10) = (undefined4)uStack_40;
      *(undefined4 *)((long)local_78._M_unused._0_8_ + 0x14) = uStack_40._4_4_;
      pcStack_60 = std::
                   _Function_handler<void_(const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/networking/gmlc/networking/TcpAcceptor.cpp:103:13)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<void_(const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/networking/gmlc/networking/TcpAcceptor.cpp:103:13)>
                 ::_M_manager;
      (*(socket.super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_Socket[7])(socket.
                         super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,&this->acceptor_);
      CLI::std::_Function_base::~_Function_base((_Function_base *)&local_78);
      start(std::shared_ptr<gmlc::networking::TcpConnection>)::$_0::~__0((__0 *)&local_b0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&ptr.super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&socket.super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return true;
    }
    TcpConnection::close
              ((conn->
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,(int)conn);
    if (((this->accepting).activated._M_base._M_i & 1U) != 0) {
      concurrency::TriggerVariable::trigger(&this->accepting);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"acceptor is not in a connected state",(allocator<char> *)&socket
              );
    logger(this,1,&local_b0);
  }
  std::__cxx11::string::~string((string *)&local_b0);
  return false;
}

Assistant:

bool TcpAcceptor::start(TcpConnection::pointer conn)
{
    if (!conn) {
        if (accepting.isActive()) {
            accepting.trigger();
        }
        logger(0, "tcpconnection is not valid");
        return false;
    }
    if (state != AcceptingStates::CONNECTED) {
        conn->close();
        if (accepting.isActive()) {
            accepting.trigger();
        }
        logger(1, "acceptor is not in a connected state");
        return false;
    }
    if (accepting.activate()) {
        auto socket = conn->socket();
        acceptor_.listen();
        auto ptr = shared_from_this();
        socket->use_with_acceptor(
            acceptor_,
            [this, apointer = std::move(ptr), connection = std::move(conn)](
                const std::error_code& error) {
                handle_accept(apointer, connection, error);
            });
        return true;
    }

    logger(1, "acceptor is already active");
    conn->close();
    return false;
}